

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfProperties.c
# Opt level: O0

sbfKeyValue sbfProperties_filterV(sbfKeyValue table,char *fmt,...)

{
  sbfKeyValue psVar1;
  char *in_R8;
  sbfKeyValue in_R9;
  char *prefix;
  va_list ap;
  sbfKeyValue new;
  char *in_stack_ffffffffffffff08;
  char **in_stack_ffffffffffffff10;
  void *local_40;
  
  sbfMemory_vasprintf(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(__va_list_tag *)0x10bfae)
  ;
  psVar1 = sbfProperties_filter(in_R9,in_R8);
  free(local_40);
  return psVar1;
}

Assistant:

sbfKeyValue
sbfProperties_filterV (sbfKeyValue table, const char* fmt, ...)
{
    sbfKeyValue new;
    va_list     ap;
    char*       prefix;

    va_start (ap, fmt);
    xvasprintf (&prefix, fmt, ap);
    va_end (ap);

    new = sbfProperties_filter (table, prefix);

    free (prefix);
    return new;
}